

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  double *pdVar4;
  value_type vVar5;
  
  vVar5 = FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                    (&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).left_;
  pFVar2 = (this->right_->fadexpr_).right_;
  pdVar4 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar4 = (pFVar1->dx_).ptr_to_data + i;
  }
  pdVar3 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar3 = (pFVar2->dx_).ptr_to_data + i;
  }
  return vVar5 + *pdVar4 * pFVar2->val_ + *pdVar3 * pFVar1->val_;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}